

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

size_t unicode_to_utf16be(char *p,size_t remaining,uint32_t uc)

{
  size_t sVar1;
  byte bVar2;
  long lStack_8;
  
  bVar2 = (byte)(uc >> 8);
  if (uc < 0x10000) {
    if (remaining < 2) {
      return 0;
    }
    *p = bVar2;
    sVar1 = 2;
    lStack_8 = 1;
  }
  else {
    if (remaining < 4) {
      return 0;
    }
    *p = (byte)(uc + 0xf0000 >> 0x12) & 3 | 0xd8;
    p[1] = (char)(uc + 0xf0000 >> 10);
    p[2] = bVar2 & 3 | 0xdc;
    sVar1 = 4;
    lStack_8 = 3;
  }
  p[lStack_8] = (char)uc;
  return sVar1;
}

Assistant:

static size_t
unicode_to_utf16be(char *p, size_t remaining, uint32_t uc)
{
	char *utf16 = p;

	if (uc > 0xffff) {
		/* We have a code point that won't fit into a
		 * wchar_t; convert it to a surrogate pair. */
		if (remaining < 4)
			return (0);
		uc -= 0x10000;
		archive_be16enc(utf16, ((uc >> 10) & 0x3ff) + 0xD800);
		archive_be16enc(utf16+2, (uc & 0x3ff) + 0xDC00);
		return (4);
	} else {
		if (remaining < 2)
			return (0);
		archive_be16enc(utf16, (uint16_t)uc);
		return (2);
	}
}